

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptor::GetLocationPath
          (FieldDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  FieldDescriptor FVar1;
  int iVar2;
  long *plVar3;
  int *__args;
  iterator iVar4;
  int local_1c;
  int local_18;
  int local_14;
  
  if (this[0x50] == (FieldDescriptor)0x1) {
    if (*(Descriptor **)(this + 0x68) == (Descriptor *)0x0) {
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar4._M_current ==
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)output,iVar4,
                   &FileDescriptorProto::kExtensionFieldNumber);
        FVar1 = this[0x50];
      }
      else {
        *iVar4._M_current = 7;
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar4._M_current + 1;
        FVar1 = (FieldDescriptor)0x1;
      }
      if (((byte)FVar1 & 1) == 0) {
        plVar3 = (long *)(*(long *)(this + 0x58) + 0x30);
      }
      else if (*(long *)(this + 0x68) == 0) {
        plVar3 = (long *)(*(long *)(this + 0x30) + 0x98);
      }
      else {
        plVar3 = (long *)(*(long *)(this + 0x68) + 0x80);
      }
      iVar2 = (int)((ulong)((long)this - *plVar3) >> 3) * 0x3cf3cf3d;
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar4._M_current !=
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) goto LAB_002dccd3;
      __args = &local_14;
      local_14 = iVar2;
    }
    else {
      Descriptor::GetLocationPath(*(Descriptor **)(this + 0x68),output);
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar4._M_current ==
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)output,iVar4,
                   &DescriptorProto::kExtensionFieldNumber);
      }
      else {
        *iVar4._M_current = 6;
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar4._M_current + 1;
      }
      if (this[0x50] == (FieldDescriptor)0x0) {
        plVar3 = (long *)(*(long *)(this + 0x58) + 0x30);
      }
      else if (*(long *)(this + 0x68) == 0) {
        plVar3 = (long *)(*(long *)(this + 0x30) + 0x98);
      }
      else {
        plVar3 = (long *)(*(long *)(this + 0x68) + 0x80);
      }
      iVar2 = (int)((ulong)((long)this - *plVar3) >> 3) * 0x3cf3cf3d;
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar4._M_current !=
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
LAB_002dccd3:
        *iVar4._M_current = iVar2;
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar4._M_current + 1;
        return;
      }
      __args = &local_18;
      local_18 = iVar2;
    }
  }
  else {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x58),output);
    iVar4._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)output,iVar4,&DescriptorProto::kFieldFieldNumber
                );
    }
    else {
      *iVar4._M_current = 2;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar4._M_current + 1;
    }
    if (this[0x50] == (FieldDescriptor)0x0) {
      plVar3 = (long *)(*(long *)(this + 0x58) + 0x30);
    }
    else if (*(long *)(this + 0x68) == 0) {
      plVar3 = (long *)(*(long *)(this + 0x30) + 0x98);
    }
    else {
      plVar3 = (long *)(*(long *)(this + 0x68) + 0x80);
    }
    iVar2 = (int)((ulong)((long)this - *plVar3) >> 3) * 0x3cf3cf3d;
    iVar4._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current !=
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_002dccd3;
    __args = &local_1c;
    local_1c = iVar2;
  }
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,__args);
  return;
}

Assistant:

void FieldDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (is_extension()) {
    if (extension_scope() == NULL) {
      output->push_back(FileDescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    } else {
      extension_scope()->GetLocationPath(output);
      output->push_back(DescriptorProto::kExtensionFieldNumber);
      output->push_back(index());
    }
  } else {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kFieldFieldNumber);
    output->push_back(index());
  }
}